

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int end_set_error(END_HANDLE end,ERROR_HANDLE error_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (end == (END_HANDLE)0x0) {
    iVar2 = 0x2664;
  }
  else {
    if (error_value == (ERROR_HANDLE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(error_value->composite_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x266c;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(end->composite_value,0,item_value);
      iVar2 = 0x2672;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int end_set_error(END_HANDLE end, ERROR_HANDLE error_value)
{
    int result;

    if (end == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        END_INSTANCE* end_instance = (END_INSTANCE*)end;
        AMQP_VALUE error_amqp_value = amqpvalue_create_error(error_value);
        if (error_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(end_instance->composite_value, 0, error_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(error_amqp_value);
        }
    }

    return result;
}